

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_utils.c
# Opt level: O2

char * apprun_shell_expand_variables(char *str,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  uint uVar4;
  uint new_size;
  uint section_len;
  ulong uVar5;
  char *local_40;
  
  uVar4 = 0;
  if (str == (char *)0x0) {
    local_40 = (char *)0x0;
  }
  else {
    local_40 = (char *)calloc(1,8);
    new_size = 1;
    while (*str != '\0') {
      pcVar1 = apprun_shell_find_var_start(str);
      pcVar2 = apprun_shell_find_var_end(pcVar1);
      uVar5 = (long)pcVar1 - (long)str;
      if (str <= pcVar1 && uVar5 != 0) {
        uVar4 = uVar4 + (int)uVar5;
        if (new_size < uVar4) {
          new_size = new_size + (int)uVar5;
          local_40 = apprun_string_extend(local_40,new_size);
        }
        strncat(local_40,str,uVar5 & 0xffffffff);
      }
      str = pcVar2;
      if (pcVar1 != pcVar2) {
        pcVar1 = apprun_shell_extract_var_name(pcVar1);
        pcVar2 = apprun_shell_resolve_var_value(argv,pcVar1);
        free(pcVar1);
        if (pcVar2 != (char *)0x0) {
          sVar3 = strlen(pcVar2);
          uVar4 = uVar4 + (int)sVar3;
          if (new_size < uVar4) {
            new_size = new_size + (int)sVar3;
            local_40 = apprun_string_extend(local_40,new_size);
          }
          strcat(local_40,pcVar2);
          free(pcVar2);
        }
      }
    }
  }
  return local_40;
}

Assistant:

char *apprun_shell_expand_variables(char const *str, char **argv) {
    if (str == NULL)
        return NULL;

    unsigned buffer_capacity = 1;
    unsigned buffer_len = 0;
    char *buffer = calloc(buffer_capacity, sizeof(char *));

    char const *itr = str;

    while (*itr != '\0') {
        char const *var_start = apprun_shell_find_var_start(itr);
        char const *var_end = apprun_shell_find_var_end(var_start);


        if (var_start > itr) {
            unsigned section_len = var_start - itr;
            if (buffer_len + section_len > buffer_capacity) {
                buffer_capacity = buffer_capacity + section_len;
                buffer = apprun_string_extend(buffer, buffer_capacity);
            }

            strncat(buffer, itr, section_len);
            buffer_len += section_len;
        }


        if (var_start != var_end) {
            char *var_name = apprun_shell_extract_var_name(var_start);
            char *var_value = apprun_shell_resolve_var_value(argv, var_name);

            free(var_name);

            if (var_value) {
                unsigned section_len = strlen(var_value);
                if (buffer_len + section_len > buffer_capacity) {
                    buffer_capacity = buffer_capacity + section_len;
                    buffer = apprun_string_extend(buffer, buffer_capacity);
                }

                strcat(buffer, var_value);
                buffer_len += section_len;
                free(var_value);
            }
        }

        itr = var_end;
    }


    return buffer;
}